

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::ReadMessage
               (CodedInputStream *input,MessageLite *value)

{
  bool bVar1;
  uint uVar2;
  pair<int,_int> pVar3;
  Limit local_2c;
  pair<int,_int> p;
  int length;
  MessageLite *value_local;
  CodedInputStream *input_local;
  
  unique0x10000075 = value;
  bVar1 = io::CodedInputStream::ReadVarintSizeAsInt(input,&p.first);
  if (((bVar1) &&
      (pVar3 = io::CodedInputStream::IncrementRecursionDepthAndPushLimit(input,p.first),
      -1 < (long)pVar3)) &&
     (uVar2 = (*stack0xffffffffffffffe0->_vptr_MessageLite[0xb])(stack0xffffffffffffffe0,input),
     (uVar2 & 1) != 0)) {
    local_2c = pVar3.first;
    bVar1 = io::CodedInputStream::DecrementRecursionDepthAndPopLimit(input,local_2c);
    return bVar1;
  }
  return false;
}

Assistant:

inline bool WireFormatLite::ReadMessage(io::CodedInputStream* input,
                                        MessageLite* value) {
  int length;
  if (!input->ReadVarintSizeAsInt(&length)) return false;
  std::pair<io::CodedInputStream::Limit, int> p =
      input->IncrementRecursionDepthAndPushLimit(length);
  if (p.second < 0 || !value->MergePartialFromCodedStream(input)) return false;
  // Make sure that parsing stopped when the limit was hit, not at an endgroup
  // tag.
 return input->DecrementRecursionDepthAndPopLimit(p.first);
}